

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.h
# Opt level: O0

void __thiscall Bus::~Bus(Bus *this)

{
  Bus *this_local;
  
  std::shared_ptr<Catridge>::~shared_ptr(&this->cart);
  m2C02::~m2C02(&this->ppu);
  m6502::~m6502(&this->cpu);
  return;
}

Assistant:

~Bus() {}